

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::Binder::BindWithCTE<duckdb::SetOperationNode>
          (BoundStatement *__return_storage_ptr__,Binder *this,SetOperationNode *statement)

{
  shared_ptr<duckdb::Binder,_true> *this_00;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var1;
  pointer pCVar2;
  undefined8 uVar3;
  type pBVar4;
  pointer pBVar5;
  Binder *pBVar6;
  SetOperationNode *pSVar7;
  Binder *pBVar8;
  type pBVar9;
  CorrelatedColumnInfo *c;
  pointer info;
  vector<duckdb::CorrelatedColumnInfo,_true> *this_01;
  unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true> bound_cte;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  ClientContext *pCStack_80;
  __node_base local_78;
  pointer local_70;
  __node_base _Stack_68;
  pointer local_60;
  vector<duckdb::LogicalType,_true> *local_58;
  Binder *local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  QueryNode::Cast<duckdb::SetOperationNode>(&statement->super_QueryNode);
  BindMaterializedCTE((Binder *)local_a0,(CommonTableExpressionMap *)this);
  if ((element_type *)local_a0._0_8_ == (element_type *)0x0) {
    pSVar7 = QueryNode::Cast<duckdb::SetOperationNode>(&statement->super_QueryNode);
    Bind((BoundStatement *)local_90,this,&pSVar7->super_QueryNode);
    uVar3 = local_90._0_8_;
    local_90._0_8_ =
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )0x0;
    _Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (__return_storage_ptr__->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (__return_storage_ptr__->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar3;
    if (_Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      (**(code **)(*(long *)_Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                            _M_head_impl + 8))();
    }
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (__return_storage_ptr__->types).
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (__return_storage_ptr__->types).
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (__return_storage_ptr__->types).
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->types).
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_90._8_8_;
    (__return_storage_ptr__->types).
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pCStack_80;
    (__return_storage_ptr__->types).
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_78._M_nxt;
    local_90._8_8_ = (pointer)0x0;
    pCStack_80 = (ClientContext *)0x0;
    local_78._M_nxt = (_Hash_node_base *)0x0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(__return_storage_ptr__->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(__return_storage_ptr__->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(__return_storage_ptr__->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_70;
    (__return_storage_ptr__->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_68._M_nxt;
    (__return_storage_ptr__->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_60;
    local_70 = (pointer)0x0;
    _Stack_68._M_nxt = (_Hash_node_base *)0x0;
    local_60 = (pointer)0x0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_70);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_90 + 8));
    if ((LogicalOperator *)local_90._0_8_ != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_90._0_8_ + 8))();
    }
  }
  else {
    pBVar4 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
             operator*((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)local_a0);
    while ((pBVar4->child).
           super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
           .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl !=
           (BoundQueryNode *)0x0) {
      pBVar5 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
               ::operator->(&pBVar4->child);
      if (pBVar5->type != CTE_NODE) break;
      pBVar5 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
               ::operator->(&pBVar4->child);
      pBVar4 = BoundQueryNode::Cast<duckdb::BoundCTENode>(pBVar5);
    }
    this_00 = &pBVar4->child_binder;
    pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
    pSVar7 = QueryNode::Cast<duckdb::SetOperationNode>(&statement->super_QueryNode);
    Bind((BoundStatement *)local_90,pBVar6,&pSVar7->super_QueryNode);
    uVar3 = local_90._0_8_;
    local_90._0_8_ =
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )0x0;
    _Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (__return_storage_ptr__->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (__return_storage_ptr__->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar3;
    local_50 = this;
    if (_Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      (**(code **)(*(long *)_Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                            _M_head_impl + 8))();
    }
    local_58 = &__return_storage_ptr__->types;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (__return_storage_ptr__->types).
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (__return_storage_ptr__->types).
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (__return_storage_ptr__->types).
         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->types).
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_90._8_8_;
    (__return_storage_ptr__->types).
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pCStack_80;
    (__return_storage_ptr__->types).
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_78._M_nxt;
    local_90._8_8_ = (pointer)0x0;
    pCStack_80 = (ClientContext *)0x0;
    local_78._M_nxt = (_Hash_node_base *)0x0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(__return_storage_ptr__->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(__return_storage_ptr__->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(__return_storage_ptr__->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_70;
    (__return_storage_ptr__->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_68._M_nxt;
    (__return_storage_ptr__->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_60;
    local_70 = (pointer)0x0;
    _Stack_68._M_nxt = (_Hash_node_base *)0x0;
    local_60 = (pointer)0x0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_70);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_90 + 8));
    if ((LogicalOperator *)local_90._0_8_ != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_90._0_8_ + 8))();
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(pBVar4->super_BoundQueryNode).types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &local_58->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    pBVar6 = local_50;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(pBVar4->super_BoundQueryNode).names,
                &(__return_storage_ptr__->names).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar4->query_binder);
    pCVar2 = (pBVar8->correlated_columns).
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             .
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (info = (pBVar8->correlated_columns).
                super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                .
                super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; info != pCVar2; info = info + 1) {
      pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
      AddCorrelatedColumn(pBVar8,info);
    }
    pBVar9 = shared_ptr<duckdb::Binder,_true>::operator*(this_00);
    this_01 = &pBVar9->correlated_columns;
    MergeCorrelatedColumns(pBVar6,this_01);
    ::std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
    _M_erase_at_end(&this_01->
                     super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                    ,(this_01->
                     super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                     ).
                     super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    _Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (__return_storage_ptr__->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (__return_storage_ptr__->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
    pBVar4 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
             operator*((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)local_a0);
    local_a0._8_8_ = _Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    CreatePlan((Binder *)local_90,(BoundCTENode *)pBVar6,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)pBVar4);
    uVar3 = local_90._0_8_;
    local_90._0_8_ = (LogicalOperator *)0x0;
    _Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (__return_storage_ptr__->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (__return_storage_ptr__->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar3;
    if (_Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      (**(code **)(*(long *)_Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                            _M_head_impl + 8))();
    }
    if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
        local_90._0_8_ != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_90._0_8_ + 8))();
    }
    local_90._0_8_ =
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )0x0;
    if ((LogicalOperator *)local_a0._8_8_ != (LogicalOperator *)0x0) {
      (*(*(_func_int ***)local_a0._8_8_)[1])();
    }
    local_a0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if ((_Tuple_impl<0UL,_duckdb::BoundCTENode_*,_std::default_delete<duckdb::BoundCTENode>_>)
      local_a0._0_8_ != (BoundCTENode *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_a0._0_8_)->__weak_this_).internal
                .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::BindWithCTE(T &statement) {
	BoundStatement bound_statement;
	auto bound_cte = BindMaterializedCTE(statement.template Cast<T>().cte_map);
	if (bound_cte) {
		reference<BoundCTENode> tail_ref = *bound_cte;

		while (tail_ref.get().child && tail_ref.get().child->type == QueryNodeType::CTE_NODE) {
			tail_ref = tail_ref.get().child->Cast<BoundCTENode>();
		}

		auto &tail = tail_ref.get();
		bound_statement = tail.child_binder->Bind(statement.template Cast<T>());

		tail.types = bound_statement.types;
		tail.names = bound_statement.names;

		for (auto &c : tail.query_binder->correlated_columns) {
			tail.child_binder->AddCorrelatedColumn(c);
		}
		MoveCorrelatedExpressions(*tail.child_binder);

		auto plan = std::move(bound_statement.plan);
		bound_statement.plan = CreatePlan(*bound_cte, std::move(plan));
	} else {
		bound_statement = Bind(statement.template Cast<T>());
	}
	return bound_statement;
}